

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

realtype N_VDotProd_SensWrapper(N_Vector x,N_Vector y)

{
  int i;
  long lVar1;
  realtype rVar2;
  realtype rVar3;
  
  rVar2 = 0.0;
  for (lVar1 = 0; lVar1 < (int)*(long *)((long)x->content + 8); lVar1 = lVar1 + 1) {
    rVar3 = N_VDotProd(*(N_Vector *)(*x->content + lVar1 * 8),*(N_Vector *)(*y->content + lVar1 * 8)
                      );
    rVar2 = rVar2 + rVar3;
  }
  return rVar2;
}

Assistant:

realtype N_VDotProd_SensWrapper(N_Vector x, N_Vector y)
{
  int i;
  realtype sum;

  sum = ZERO;

  for (i=0; i < NV_NVECS_SW(x); i++)
    sum += N_VDotProd(NV_VEC_SW(x,i), NV_VEC_SW(y,i));

  return(sum);
}